

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O2

void roaring64_bitmap_or_inplace(roaring64_bitmap_t *r1,roaring64_bitmap_t *r2)

{
  container_t *c1;
  ulong uVar1;
  art_val_t *paVar2;
  art_val_t *paVar3;
  uint8_t type2;
  int iVar4;
  container_t *pcVar5;
  leaf_t val;
  uint8_t type1;
  uint8_t typecode2;
  art_iterator_t it2;
  art_iterator_t it1;
  
  if (r1 != r2) {
    art_init_iterator(&it1,&r1->art,true);
    art_init_iterator(&it2,&r2->art,true);
LAB_0011d7ed:
    while( true ) {
      paVar3 = it1.value;
      paVar2 = it2.value;
      if (it1.value == (art_val_t *)0x0 && it2.value == (art_val_t *)0x0) break;
      if (it1.value == (art_val_t *)0x0 || it2.value == (art_val_t *)0x0) {
        if (it1.value == (art_val_t *)0x0) goto LAB_0011d89a;
        if (it2.value == (art_val_t *)0x0) goto LAB_0011d843;
      }
      else {
        iVar4 = art_compare_keys(it1.key,it2.key);
        if (iVar4 == 0) {
          c1 = r1->containers[*paVar3 >> 8];
          type2 = (uint8_t)*paVar2;
          type1 = (uint8_t)*paVar3;
          if (type1 == '\x04') {
            pcVar5 = container_or(c1,'\x04',r2->containers[*paVar2 >> 8],type2,&typecode2);
          }
          else {
            pcVar5 = container_ior(c1,type1,r2->containers[*paVar2 >> 8],type2,&typecode2);
          }
          if (pcVar5 != c1) {
            container_free(c1,type1);
            uVar1 = *paVar3;
            r1->containers[uVar1 >> 8] = pcVar5;
            *paVar3 = CONCAT71((int7)(uVar1 >> 8),typecode2);
          }
          art_iterator_next(&it1);
          art_iterator_next(&it2);
        }
        else {
          if (paVar2 != (art_val_t *)0x0 && -1 < iVar4) goto LAB_0011d8a3;
LAB_0011d843:
          art_iterator_next(&it1);
        }
      }
    }
  }
  return;
LAB_0011d89a:
  if (it2.value != (art_val_t *)0x0) {
LAB_0011d8a3:
    val = copy_leaf_container(r2,r1,*paVar2);
    art_iterator_insert(&it1,it2.key,val);
    art_iterator_next(&it2);
  }
  goto LAB_0011d7ed;
}

Assistant:

void roaring64_bitmap_or_inplace(roaring64_bitmap_t *r1,
                                 const roaring64_bitmap_t *r2) {
    if (r1 == r2) {
        return;
    }
    art_iterator_t it1 = art_init_iterator(&r1->art, /*first=*/true);
    art_iterator_t it2 = art_init_iterator((art_t *)&r2->art, /*first=*/true);

    while (it1.value != NULL || it2.value != NULL) {
        bool it1_present = it1.value != NULL;
        bool it2_present = it2.value != NULL;

        // Cases:
        // 1. it1_present  && !it2_present -> it1++
        // 2. !it1_present && it2_present  -> add it2, it2++
        // 3. it1_present  && it2_present
        //    a. it1 <  it2 -> it1++
        //    b. it1 == it2 -> it1 | it2, it1++, it2++
        //    c. it1 >  it2 -> add it2, it2++
        int compare_result = 0;
        if (it1_present && it2_present) {
            compare_result = compare_high48(it1.key, it2.key);
            if (compare_result == 0) {
                // Case 3b: iterators at the same high key position.
                leaf_t *leaf1 = (leaf_t *)it1.value;
                leaf_t leaf2 = (leaf_t)*it2.value;
                uint8_t typecode1 = get_typecode(*leaf1);
                container_t *container1 = get_container(r1, *leaf1);
                uint8_t typecode2;
                container_t *container2;
                if (get_typecode(*leaf1) == SHARED_CONTAINER_TYPE) {
                    container2 = container_or(container1, typecode1,
                                              get_container(r2, leaf2),
                                              get_typecode(leaf2), &typecode2);
                } else {
                    container2 = container_ior(container1, typecode1,
                                               get_container(r2, leaf2),
                                               get_typecode(leaf2), &typecode2);
                }
                if (container2 != container1) {
                    container_free(container1, typecode1);
                    replace_container(r1, leaf1, container2, typecode2);
                }
                art_iterator_next(&it1);
                art_iterator_next(&it2);
            }
        }
        if ((it1_present && !it2_present) || compare_result < 0) {
            // Cases 1 and 3a: it1 is the only iterator or is before it2.
            art_iterator_next(&it1);
        } else if ((!it1_present && it2_present) || compare_result > 0) {
            // Cases 2 and 3c: it2 is the only iterator or is before it1.
            leaf_t result_leaf =
                copy_leaf_container(r2, r1, (leaf_t)*it2.value);
            art_iterator_insert(&it1, it2.key, (art_val_t)result_leaf);
            art_iterator_next(&it2);
        }
    }
}